

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_device_post_init(ma_device *pDevice,ma_device_type deviceType,
                             ma_device_descriptor *pDescriptorPlayback,
                             ma_device_descriptor *pDescriptorCapture)

{
  ma_bool32 mVar1;
  ma_uint32 mVar2;
  ma_device_type type;
  undefined1 local_640 [8];
  ma_device_info_conflict deviceInfo;
  ma_result result;
  ma_device_descriptor *pDescriptorCapture_local;
  ma_device_descriptor *pDescriptorPlayback_local;
  ma_device_type deviceType_local;
  ma_device *pDevice_local;
  
  if (pDevice == (ma_device *)0x0) {
    pDevice_local._4_4_ = MA_INVALID_ARGS;
  }
  else {
    if (((deviceType == ma_device_type_capture) || (deviceType == ma_device_type_duplex)) ||
       (deviceType == ma_device_type_loopback)) {
      mVar1 = ma_device_descriptor_is_valid(pDescriptorCapture);
      if (mVar1 == 0) {
        return MA_INVALID_ARGS;
      }
      (pDevice->capture).internalFormat = pDescriptorCapture->format;
      (pDevice->capture).internalChannels = pDescriptorCapture->channels;
      (pDevice->capture).internalSampleRate = pDescriptorCapture->sampleRate;
      memcpy((pDevice->capture).internalChannelMap,pDescriptorCapture->channelMap,0xfe);
      (pDevice->capture).internalPeriodSizeInFrames = pDescriptorCapture->periodSizeInFrames;
      (pDevice->capture).internalPeriods = pDescriptorCapture->periodCount;
      if ((pDevice->capture).internalPeriodSizeInFrames == 0) {
        mVar2 = ma_calculate_buffer_size_in_frames_from_milliseconds
                          (pDescriptorCapture->periodSizeInMilliseconds,
                           pDescriptorCapture->sampleRate);
        (pDevice->capture).internalPeriodSizeInFrames = mVar2;
      }
    }
    if ((deviceType == ma_device_type_playback) || (deviceType == ma_device_type_duplex)) {
      mVar1 = ma_device_descriptor_is_valid(pDescriptorPlayback);
      if (mVar1 == 0) {
        return MA_INVALID_ARGS;
      }
      (pDevice->playback).internalFormat = pDescriptorPlayback->format;
      (pDevice->playback).internalChannels = pDescriptorPlayback->channels;
      (pDevice->playback).internalSampleRate = pDescriptorPlayback->sampleRate;
      memcpy((pDevice->playback).internalChannelMap,pDescriptorPlayback->channelMap,0xfe);
      (pDevice->playback).internalPeriodSizeInFrames = pDescriptorPlayback->periodSizeInFrames;
      (pDevice->playback).internalPeriods = pDescriptorPlayback->periodCount;
      if ((pDevice->playback).internalPeriodSizeInFrames == 0) {
        mVar2 = ma_calculate_buffer_size_in_frames_from_milliseconds
                          (pDescriptorPlayback->periodSizeInMilliseconds,
                           pDescriptorPlayback->sampleRate);
        (pDevice->playback).internalPeriodSizeInFrames = mVar2;
      }
    }
    if (((deviceType == ma_device_type_capture) || (deviceType == ma_device_type_duplex)) ||
       (deviceType == ma_device_type_loopback)) {
      type = ma_device_type_capture;
      if (deviceType == ma_device_type_loopback) {
        type = ma_device_type_playback;
      }
      deviceInfo.nativeDataFormats[0x3f].flags =
           ma_device_get_info(pDevice,type,(ma_device_info_conflict *)local_640);
      if (deviceInfo.nativeDataFormats[0x3f].flags == MA_SUCCESS) {
        ma_strncpy_s((pDevice->capture).name,0x100,deviceInfo.id.alsa + 0xf8,0xffffffffffffffff);
      }
      else if (pDescriptorCapture->pDeviceID == (ma_device_id *)0x0) {
        ma_strncpy_s((pDevice->capture).name,0x100,"Default Capture Device",0xffffffffffffffff);
      }
      else {
        ma_strncpy_s((pDevice->capture).name,0x100,"Capture Device",0xffffffffffffffff);
      }
    }
    if ((deviceType == ma_device_type_playback) || (deviceType == ma_device_type_duplex)) {
      deviceInfo.nativeDataFormats[0x3f].flags =
           ma_device_get_info(pDevice,ma_device_type_playback,(ma_device_info_conflict *)local_640);
      if (deviceInfo.nativeDataFormats[0x3f].flags == MA_SUCCESS) {
        ma_strncpy_s((pDevice->playback).name,0x100,deviceInfo.id.alsa + 0xf8,0xffffffffffffffff);
      }
      else if (pDescriptorPlayback->pDeviceID == (ma_device_id *)0x0) {
        ma_strncpy_s((pDevice->playback).name,0x100,"Default Playback Device",0xffffffffffffffff);
      }
      else {
        ma_strncpy_s((pDevice->playback).name,0x100,"Playback Device",0xffffffffffffffff);
      }
    }
    pDevice_local._4_4_ = ma_device__post_init_setup(pDevice,deviceType);
  }
  return pDevice_local._4_4_;
}

Assistant:

MA_API ma_result ma_device_post_init(ma_device* pDevice, ma_device_type deviceType, const ma_device_descriptor* pDescriptorPlayback, const ma_device_descriptor* pDescriptorCapture)
{
    ma_result result;

    if (pDevice == NULL) {
        return MA_INVALID_ARGS;
    }

    /* Capture. */
    if (deviceType == ma_device_type_capture || deviceType == ma_device_type_duplex || deviceType == ma_device_type_loopback) {
        if (ma_device_descriptor_is_valid(pDescriptorCapture) == MA_FALSE) {
            return MA_INVALID_ARGS;
        }

        pDevice->capture.internalFormat             = pDescriptorCapture->format;
        pDevice->capture.internalChannels           = pDescriptorCapture->channels;
        pDevice->capture.internalSampleRate         = pDescriptorCapture->sampleRate;
        MA_COPY_MEMORY(pDevice->capture.internalChannelMap, pDescriptorCapture->channelMap, sizeof(pDescriptorCapture->channelMap));
        pDevice->capture.internalPeriodSizeInFrames = pDescriptorCapture->periodSizeInFrames;
        pDevice->capture.internalPeriods            = pDescriptorCapture->periodCount;

        if (pDevice->capture.internalPeriodSizeInFrames == 0) {
            pDevice->capture.internalPeriodSizeInFrames = ma_calculate_buffer_size_in_frames_from_milliseconds(pDescriptorCapture->periodSizeInMilliseconds, pDescriptorCapture->sampleRate);
        }
    }

    /* Playback. */
    if (deviceType == ma_device_type_playback || deviceType == ma_device_type_duplex) {
        if (ma_device_descriptor_is_valid(pDescriptorPlayback) == MA_FALSE) {
            return MA_INVALID_ARGS;
        }

        pDevice->playback.internalFormat             = pDescriptorPlayback->format;
        pDevice->playback.internalChannels           = pDescriptorPlayback->channels;
        pDevice->playback.internalSampleRate         = pDescriptorPlayback->sampleRate;
        MA_COPY_MEMORY(pDevice->playback.internalChannelMap, pDescriptorPlayback->channelMap, sizeof(pDescriptorPlayback->channelMap));
        pDevice->playback.internalPeriodSizeInFrames = pDescriptorPlayback->periodSizeInFrames;
        pDevice->playback.internalPeriods            = pDescriptorPlayback->periodCount;

        if (pDevice->playback.internalPeriodSizeInFrames == 0) {
            pDevice->playback.internalPeriodSizeInFrames = ma_calculate_buffer_size_in_frames_from_milliseconds(pDescriptorPlayback->periodSizeInMilliseconds, pDescriptorPlayback->sampleRate);
        }
    }

    /*
    The name of the device can be retrieved from device info. This may be temporary and replaced with a `ma_device_get_info(pDevice, deviceType)` instead.
    For loopback devices, we need to retrieve the name of the playback device.
    */
    {
        ma_device_info deviceInfo;

        if (deviceType == ma_device_type_capture || deviceType == ma_device_type_duplex || deviceType == ma_device_type_loopback) {
            result = ma_device_get_info(pDevice, (deviceType == ma_device_type_loopback) ? ma_device_type_playback : ma_device_type_capture, &deviceInfo);
            if (result == MA_SUCCESS) {
                ma_strncpy_s(pDevice->capture.name, sizeof(pDevice->capture.name), deviceInfo.name, (size_t)-1);
            } else {
                /* We failed to retrieve the device info. Fall back to a default name. */
                if (pDescriptorCapture->pDeviceID == NULL) {
                    ma_strncpy_s(pDevice->capture.name, sizeof(pDevice->capture.name), MA_DEFAULT_CAPTURE_DEVICE_NAME, (size_t)-1);
                } else {
                    ma_strncpy_s(pDevice->capture.name, sizeof(pDevice->capture.name), "Capture Device", (size_t)-1);
                }
            }
        }

        if (deviceType == ma_device_type_playback || deviceType == ma_device_type_duplex) {
            result = ma_device_get_info(pDevice, ma_device_type_playback, &deviceInfo);
            if (result == MA_SUCCESS) {
                ma_strncpy_s(pDevice->playback.name, sizeof(pDevice->playback.name), deviceInfo.name, (size_t)-1);
            } else {
                /* We failed to retrieve the device info. Fall back to a default name. */
                if (pDescriptorPlayback->pDeviceID == NULL) {
                    ma_strncpy_s(pDevice->playback.name, sizeof(pDevice->playback.name), MA_DEFAULT_PLAYBACK_DEVICE_NAME, (size_t)-1);
                } else {
                    ma_strncpy_s(pDevice->playback.name, sizeof(pDevice->playback.name), "Playback Device", (size_t)-1);
                }
            }
        }
    }

    /* Update data conversion. */
    return ma_device__post_init_setup(pDevice, deviceType); /* TODO: Should probably rename ma_device__post_init_setup() to something better. */
}